

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.cpp
# Opt level: O3

ValueInfo * __thiscall ValueInfo::SpecializeToFloat64(ValueInfo *this,JitArenaAllocator *allocator)

{
  ValueType *this_00;
  bool bVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar2;
  
  this_00 = &this->super_ValueType;
  bVar1 = ValueType::IsNumber(this_00);
  if (!bVar1) {
    this = CopyWithGenericStructureKind(this,allocator);
    bVar1 = ValueType::IsLikelyInt(this_00);
    if (bVar1) {
      aVar2.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToDefiniteAnyNumber(this_00);
    }
    else {
      aVar2.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToDefiniteAnyFloat(this_00);
    }
    (this->super_ValueType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)aVar2;
  }
  return this;
}

Assistant:

ValueInfo *
ValueInfo::SpecializeToFloat64(JitArenaAllocator *const allocator)
{
    if (IsNumber())
    {
        return this;
    }

    ValueInfo *const newValueInfo = CopyWithGenericStructureKind(allocator);

    // If the value type was likely int, after float-specializing, it's preferable to use Int_Number rather than Float, as the
    // former is also likely int and allows int specialization later.
    newValueInfo->Type() = IsLikelyInt() ? Type().ToDefiniteAnyNumber() : Type().ToDefiniteAnyFloat();

    return newValueInfo;
}